

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O0

CSerializedNetMsg *
NetMsg::Make<unsigned_char&,uint256,std::vector<uint256,std::allocator<uint256>>&>
          (string *msg_type,uchar *args,uint256 *args_1,
          vector<uint256,_std::allocator<uint256>_> *args_2)

{
  long lVar1;
  uint256 *in_RSI;
  CSerializedNetMsg *in_RDI;
  long in_FS_OFFSET;
  CSerializedNetMsg *msg;
  CSerializedNetMsg *in_stack_ffffffffffffff88;
  CSerializedNetMsg *args_00;
  size_t in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar2;
  CSerializedNetMsg *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  args_00 = in_RDI;
  __str = in_RDI;
  CSerializedNetMsg::CSerializedNetMsg(in_stack_ffffffffffffff88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffffe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  VectorWriter::VectorWriter<unsigned_char&,uint256,std::vector<uint256,std::allocator<uint256>>&>
            ((VectorWriter *)CONCAT17(uVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,(uchar *)args_00,in_RSI,
             (vector<uint256,_std::allocator<uint256>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }